

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  char cVar2;
  format_specs *pfVar3;
  num_writer f;
  int iVar4;
  int iVar5;
  int num_digits;
  size_type sVar6;
  int iVar7;
  string_view prefix;
  string groups;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  grouping_impl<wchar_t>(&local_68,(locale_ref)(this->writer->locale_).locale_);
  if (local_68._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar1 = this->specs->thousands;
    if (cVar1 == '\0') {
      on_dec(this);
    }
    else {
      iVar4 = count_digits(this->abs_value);
      num_digits = (int)local_68._M_string_length + iVar4;
      iVar5 = iVar4;
      for (sVar6 = 0; local_68._M_string_length != sVar6; sVar6 = sVar6 + 1) {
        cVar2 = local_68._M_dataplus._M_p[sVar6];
        iVar7 = iVar5 - cVar2;
        if ((iVar7 == 0 || iVar5 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) {
          num_digits = iVar4 + (int)sVar6;
          if (local_68._M_string_length != sVar6) goto LAB_00e830e8;
          break;
        }
        iVar5 = iVar7;
      }
      num_digits = (iVar5 + -1) / (int)local_68._M_dataplus._M_p[local_68._M_string_length - 1] +
                   num_digits;
LAB_00e830e8:
      pfVar3 = this->specs;
      local_28 = *(undefined8 *)((pfVar3->fill).data_ + 5);
      local_48._0_4_ = pfVar3->width;
      local_48._4_4_ = pfVar3->precision;
      uStack_40._0_1_ = pfVar3->type;
      uStack_40._1_3_ = *(undefined3 *)&pfVar3->field_0x9;
      uStack_40._4_4_ = (pfVar3->fill).data_[0];
      local_38 = *(undefined8 *)((pfVar3->fill).data_ + 1);
      uStack_30 = *(undefined8 *)((pfVar3->fill).data_ + 3);
      f._12_4_ = uStack_7c;
      f.size = num_digits;
      f._28_4_ = uStack_6c;
      f.sep = (int)cVar1;
      f.abs_value = this->abs_value;
      f.groups = &local_68;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
      write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<wchar_t>>::num_writer>
                ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this->writer,num_digits,
                 prefix,*pfVar3,f);
    }
  }
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }